

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O1

lzma_ret lz_encode(lzma_coder_conflict14 *coder,lzma_allocator *allocator,uint8_t *in,size_t *in_pos
                  ,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *__dest;
  lzma_code_function_conflict12 p_Var4;
  lzma_ret lVar5;
  uint uVar6;
  lzma_ret unaff_EBX;
  uint uVar7;
  bool bVar8;
  ulong local_50;
  uint8_t *local_48;
  size_t *local_40;
  lzma_allocator *local_38;
  
  local_48 = in;
  local_38 = allocator;
  do {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    if ((action == LZMA_RUN) && (in_size <= *in_pos)) {
      return LZMA_OK;
    }
    if (((coder->mf).action == LZMA_RUN) &&
       (uVar6 = (coder->mf).read_pos, (coder->mf).read_limit <= uVar6)) {
      uVar2 = (coder->mf).write_pos;
      if (uVar2 < uVar6) {
        __assert_fail("coder->mf.read_pos <= coder->mf.write_pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                      ,0x57,
                      "lzma_ret fill_window(lzma_coder *, lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                     );
      }
      uVar3 = (coder->mf).size;
      if (uVar3 - (coder->mf).keep_size_after <= uVar6) {
        puVar1 = &(coder->mf).keep_size_before;
        uVar7 = uVar6 - *puVar1;
        if (uVar6 < *puVar1 || uVar7 == 0) {
          __assert_fail("mf->read_pos > mf->keep_size_before",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x35,"void move_window(lzma_mf *)");
        }
        uVar7 = uVar7 & 0xfffffff0;
        uVar6 = uVar2 - uVar7;
        if (uVar2 < uVar7 || uVar6 == 0) {
          __assert_fail("mf->write_pos > move_offset",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x38,"void move_window(lzma_mf *)");
        }
        if ((ulong)uVar3 < (ulong)uVar6 + (ulong)uVar7) {
          __assert_fail("move_offset + move_size <= mf->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x3b,"void move_window(lzma_mf *)");
        }
        __dest = (coder->mf).buffer;
        memmove(__dest,__dest + uVar7,(ulong)uVar6);
        puVar1 = &(coder->mf).offset;
        *puVar1 = *puVar1 + uVar7;
        puVar1 = &(coder->mf).read_pos;
        *puVar1 = *puVar1 - uVar7;
        puVar1 = &(coder->mf).read_limit;
        *puVar1 = *puVar1 - uVar7;
        puVar1 = &(coder->mf).write_pos;
        *puVar1 = *puVar1 - uVar7;
      }
      local_50 = (ulong)(coder->mf).write_pos;
      p_Var4 = (coder->next).code;
      if (p_Var4 == (lzma_code_function_conflict12)0x0) {
        local_40 = in_pos;
        lzma_bufcpy(local_48,in_pos,in_size,(coder->mf).buffer,&local_50,(ulong)(coder->mf).size);
        if (action == LZMA_RUN) {
          lVar5 = LZMA_OK;
        }
        else {
          lVar5 = (lzma_ret)(*local_40 == in_size);
        }
      }
      else {
        lVar5 = (*p_Var4)((coder->next).coder,local_38,local_48,in_pos,in_size,(coder->mf).buffer,
                          &local_50,(ulong)(coder->mf).size,action);
      }
      (coder->mf).write_pos = (uint)local_50;
      if (lVar5 == LZMA_STREAM_END) {
        if (*in_pos != in_size) {
          __assert_fail("*in_pos == in_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x77,
                        "lzma_ret fill_window(lzma_coder *, lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                       );
        }
        (coder->mf).action = action;
        lVar5 = LZMA_OK;
        uVar6 = (uint)local_50;
LAB_004ef15a:
        (coder->mf).read_limit = uVar6;
      }
      else {
        puVar1 = &(coder->mf).keep_size_after;
        uVar6 = (uint)local_50 - *puVar1;
        if (*puVar1 <= (uint)local_50 && uVar6 != 0) goto LAB_004ef15a;
      }
      uVar6 = (coder->mf).pending;
      if ((uVar6 != 0) && (uVar2 = (coder->mf).read_pos, uVar2 < (coder->mf).read_limit)) {
        (coder->mf).pending = 0;
        if (uVar2 < uVar6) {
          __assert_fail("coder->mf.read_pos >= pending",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x8e,
                        "lzma_ret fill_window(lzma_coder *, lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                       );
        }
        (coder->mf).read_pos = uVar2 - uVar6;
        (*(coder->mf).skip)(&coder->mf,uVar6);
      }
      if (lVar5 == LZMA_OK) goto LAB_004ef19f;
      bVar8 = false;
      unaff_EBX = lVar5;
    }
    else {
LAB_004ef19f:
      lVar5 = (*(coder->lz).code)((coder->lz).coder,&coder->mf,out,out_pos,out_size);
      bVar8 = lVar5 == LZMA_OK;
      if (!bVar8) {
        (coder->mf).action = LZMA_RUN;
        unaff_EBX = lVar5;
      }
    }
    if (!bVar8) {
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

static lzma_ret
lz_encode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size, lzma_action action)
{
	while (*out_pos < out_size
			&& (*in_pos < in_size || action != LZMA_RUN)) {
		lzma_ret ret;

		// Read more data to coder->mf.buffer if needed.
		if (coder->mf.action == LZMA_RUN && coder->mf.read_pos
				>= coder->mf.read_limit)
			return_if_error(fill_window(coder, allocator,
					in, in_pos, in_size, action));

		// Encode
		ret = coder->lz.code(coder->lz.coder,
				&coder->mf, out, out_pos, out_size);
		if (ret != LZMA_OK) {
			// Setting this to LZMA_RUN for cases when we are
			// flushing. It doesn't matter when finishing or if
			// an error occurred.
			coder->mf.action = LZMA_RUN;
			return ret;
		}
	}

	return LZMA_OK;
}